

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O2

void __thiscall
VW::config::options_serializer_boost_po::serialize<unsigned_long>
          (options_serializer_boost_po *this,typed_option<unsigned_long> *typed_option)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x18," --");
  poVar1 = std::operator<<(poVar1,(string *)&(typed_option->super_base_option).m_name);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return;
}

Assistant:

void serialize(typed_option<T>& typed_option)
  {
    m_output_stream << " --" << typed_option.m_name << " " << typed_option.value();
  }